

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcBezierCurve::~IfcBezierCurve(IfcBezierCurve *this)

{
  ~IfcBezierCurve((IfcBezierCurve *)
                  &this[-1].super_IfcBSplineCurve.super_IfcBoundedCurve.super_IfcCurve.
                   super_IfcGeometricRepresentationItem.field_0x28);
  return;
}

Assistant:

IfcBezierCurve() : Object("IfcBezierCurve") {}